

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.hpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::TraverseSchema::getLocalPart(TraverseSchema *this,XMLCh *rawName)

{
  XMLStringPool *pXVar1;
  XMLStringPool *pXVar2;
  int iVar3;
  uint uVar4;
  XMLSize_t count;
  XMLCh *pXVar5;
  undefined4 extraout_var;
  XMLSize_t rawNameLen;
  int colonIndex;
  XMLCh *rawName_local;
  TraverseSchema *this_local;
  
  iVar3 = XMLString::indexOf(rawName,L':');
  count = XMLString::stringLen(rawName);
  if ((long)(iVar3 + 1) == count) {
    this_local = (TraverseSchema *)&XMLUni::fgZeroLenString;
  }
  else {
    if (iVar3 == -1) {
      XMLBuffer::set(&this->fBuffer,rawName,count);
    }
    else {
      XMLBuffer::set(&this->fBuffer,rawName + (long)iVar3 + 1,(count - (long)iVar3) - 1);
    }
    pXVar1 = this->fStringPool;
    pXVar2 = this->fStringPool;
    pXVar5 = XMLBuffer::getRawBuffer(&this->fBuffer);
    uVar4 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,pXVar5);
    iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar4);
    this_local = (TraverseSchema *)CONCAT44(extraout_var,iVar3);
  }
  return (XMLCh *)this_local;
}

Assistant:

inline const XMLCh* TraverseSchema::getLocalPart(const XMLCh* const rawName) {

    int    colonIndex = XMLString::indexOf(rawName, chColon);
    XMLSize_t rawNameLen = XMLString::stringLen(rawName);

    if (XMLSize_t(colonIndex + 1) == rawNameLen) {
        return XMLUni::fgZeroLenString;
    }

    if (colonIndex == -1) {
        fBuffer.set(rawName, rawNameLen);
    }
    else {

        fBuffer.set(rawName + colonIndex + 1, rawNameLen - colonIndex - 1);
    }

    return fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
}